

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_request.cc
# Opt level: O2

void __thiscall CSocekt::flyd_write_request_handler(CSocekt *this,lp_connection_t pConn)

{
  int iVar1;
  CMemory *this_00;
  ulong uVar2;
  CSocekt *this_01;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  undefined1 local_1038 [12];
  undefined1 local_1028 [12];
  undefined1 local_1018 [12];
  undefined1 local_1008 [12];
  Logger local_ff8;
  
  this_01 = this;
  this_00 = CMemory::GetInstance();
  uVar2 = sendproc(this_01,pConn,pConn->psendbuf,(ulong)pConn->isendlen);
  if ((long)uVar2 < 1) {
    if (uVar2 == 0xffffffffffffffff) {
      muduo::Logger::SourceFile::SourceFile<108>
                ((SourceFile *)local_1008,
                 (char (*) [108])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket_request.cc"
                );
      file_02._12_4_ = 0;
      file_02.data_ = (char *)local_1008._0_8_;
      file_02.size_ = local_1008._8_4_;
      muduo::Logger::Logger(&local_ff8,file_02,0x180,ERROR);
      muduo::LogStream::operator<<(&local_ff8.impl_.stream_,anon_var_dwarf_30e02);
      muduo::Logger::~Logger(&local_ff8);
      return;
    }
  }
  else {
    if (uVar2 != pConn->isendlen) {
      pConn->psendbuf = pConn->psendbuf + uVar2;
      pConn->isendlen = pConn->isendlen - (int)uVar2;
      return;
    }
    iVar1 = flyd_epoll_oper_event(this,pConn->fd,3,4,1,pConn);
    if (iVar1 == -1) {
      muduo::Logger::SourceFile::SourceFile<108>
                ((SourceFile *)local_1018,
                 (char (*) [108])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket_request.cc"
                );
      file._12_4_ = 0;
      file.data_ = (char *)local_1018._0_8_;
      file.size_ = local_1018._8_4_;
      muduo::Logger::Logger(&local_ff8,file,400,ERROR);
      muduo::LogStream::operator<<(&local_ff8.impl_.stream_,anon_var_dwarf_30e02);
      muduo::Logger::~Logger(&local_ff8);
    }
    if (muduo::g_logLevel < 3) {
      muduo::Logger::SourceFile::SourceFile<108>
                ((SourceFile *)local_1028,
                 (char (*) [108])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket_request.cc"
                );
      file_00._12_4_ = 0;
      file_00.data_ = (char *)local_1028._0_8_;
      file_00.size_ = local_1028._8_4_;
      muduo::Logger::Logger(&local_ff8,file_00,0x193);
      muduo::LogStream::operator<<(&local_ff8.impl_.stream_,anon_var_dwarf_30e19);
      muduo::Logger::~Logger(&local_ff8);
    }
  }
  iVar1 = sem_post((sem_t *)&this->m_semEventSendQueue);
  if (iVar1 == -1) {
    muduo::Logger::SourceFile::SourceFile<108>
              ((SourceFile *)local_1038,
               (char (*) [108])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket_request.cc"
              );
    file_01._12_4_ = 0;
    file_01.data_ = (char *)local_1038._0_8_;
    file_01.size_ = local_1038._8_4_;
    muduo::Logger::Logger(&local_ff8,file_01,0x19a,ERROR);
    muduo::LogStream::operator<<(&local_ff8.impl_.stream_,anon_var_dwarf_30e30);
    muduo::Logger::~Logger(&local_ff8);
  }
  CMemory::FreeMemory(this_00,pConn->psendMemPointer);
  pConn->psendMemPointer = (char *)0x0;
  LOCK();
  (pConn->iThrowsendCount).value_ = (pConn->iThrowsendCount).value_ + -1;
  UNLOCK();
  return;
}

Assistant:

void CSocekt::flyd_write_request_handler(lp_connection_t pConn)
{  
    CMemory *p_memory = CMemory::GetInstance();
    
    //这些代码的书写可以参照 void* CSocekt::ServerSendQueueThread(void* threadData)
    ssize_t sendsize = sendproc(pConn,pConn->psendbuf,pConn->isendlen);

    if(sendsize > 0 && sendsize != pConn->isendlen)
    {        
        //没有全部发送完毕，数据只发出去了一部分，那么发送到了哪里，剩余多少，继续记录，方便下次sendproc()时使用
        pConn->psendbuf = pConn->psendbuf + sendsize;
		pConn->isendlen = pConn->isendlen - sendsize;	
        return;
    }
    else if(sendsize == -1)
    {
        //这不太可能，可以发送数据时通知我发送数据，我发送时你却通知我发送缓冲区满？
        LOG_ERROR << "CSocekt::ngx_write_request_handler()时if(sendsize == -1)成立，这很怪异。";
        return;
    }

    if(sendsize > 0 && sendsize == pConn->isendlen) //成功发送完毕，做个通知是可以的；
    {
        //如果是成功的发送完毕数据，则把写事件通知从epoll中干掉吧；其他情况，那就是断线了，等着系统内核把连接从红黑树中干掉即可；
        if(flyd_epoll_oper_event(
                pConn->fd,          //socket句柄
                EPOLL_CTL_MOD,      //事件类型，这里是修改【因为我们准备减去写通知】
                EPOLLOUT,           //标志，这里代表要减去的标志,EPOLLOUT：可写【可写的时候通知我】
                1,                  //对于事件类型为增加的，EPOLL_CTL_MOD需要这个参数, 0：增加   1：去掉 2：完全覆盖
                pConn               //连接池中的连接
                ) == -1)
        {
            //有这情况发生？这可比较麻烦，不过先do nothing
            LOG_ERROR << "CSocekt::ngx_write_request_handler()时if(sendsize == -1)成立，这很怪异。";
        }    

            LOG_INFO << "flyd_write_request_handler数据发送完毕 ，很好！"  ;      
    }

    //能走下来的，要么数据发送完毕了，要么对端断开了，那么执行收尾工作吧；

    //数据发送完毕，或者把需要发送的数据干掉，都说明发送缓冲区可能有地方了，让发送线程往下走判断能否发送新数据
    if(sem_post(&m_semEventSendQueue)==-1)     
            LOG_ERROR << "CSocekt::ngx_write_request_handler()中sem_post(&m_semEventSendQueue)失败.";


    p_memory->FreeMemory(pConn->psendMemPointer);  //释放内存
    pConn->psendMemPointer = NULL;        
    pConn->iThrowsendCount.decrement();  //建议放在最后执行
    return;
}